

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaForce.c
# Opt level: O0

void Frc_ObjAddFanin(Frc_Obj_t *pObj,Frc_Obj_t *pFanin)

{
  uint uVar1;
  int iVar2;
  Frc_Obj_t *pFanin_local;
  Frc_Obj_t *pObj_local;
  
  if (*(uint *)pObj >> 4 <= (pObj->field_9).iFanin) {
    __assert_fail("pObj->iFanin < pObj->nFanins",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaForce.c"
                  ,0x85,"void Frc_ObjAddFanin(Frc_Obj_t *, Frc_Obj_t *)");
  }
  if (pFanin->iFanout < pFanin->nFanouts) {
    iVar2 = pObj->hHandle - pFanin->hHandle;
    uVar1 = (pObj->field_9).iFanin;
    (pObj->field_9).iFanin = uVar1 + 1;
    *(int *)(&pObj[1].field_0x0 + (ulong)uVar1 * 4) = iVar2;
    uVar1 = pFanin->iFanout;
    pFanin->iFanout = uVar1 + 1;
    *(int *)(&pFanin[1].field_0x0 + (ulong)((*(uint *)pFanin >> 4) + uVar1) * 4) = iVar2;
    return;
  }
  __assert_fail("pFanin->iFanout < pFanin->nFanouts",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaForce.c"
                ,0x86,"void Frc_ObjAddFanin(Frc_Obj_t *, Frc_Obj_t *)");
}

Assistant:

void Frc_ObjAddFanin( Frc_Obj_t * pObj, Frc_Obj_t * pFanin )
{ 
    assert( pObj->iFanin < pObj->nFanins );
    assert( pFanin->iFanout < pFanin->nFanouts );
    pFanin->Fanios[pFanin->nFanins + pFanin->iFanout++] = 
        pObj->Fanios[pObj->iFanin++] = pObj->hHandle - pFanin->hHandle;
}